

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O1

StringRef __thiscall llvm::sys::path::parent_path(path *this,StringRef path,Style style)

{
  path *ppVar1;
  path *ppVar2;
  StringRef SVar3;
  StringRef path_00;
  
  path_00.Length = (path *)path.Data;
  path_00.Data = (char *)this;
  ppVar1 = (path *)anon_unknown.dwarf_3217db::parent_path_end(path_00,(Style)path.Length);
  ppVar2 = path_00.Length;
  if (ppVar1 < path_00.Length) {
    ppVar2 = ppVar1;
  }
  if (ppVar1 == (path *)0xffffffffffffffff) {
    this = (path *)0x0;
    ppVar2 = (path *)0x0;
  }
  SVar3.Length = (size_t)ppVar2;
  SVar3.Data = (char *)this;
  return SVar3;
}

Assistant:

StringRef parent_path(StringRef path, Style style) {
  size_t end_pos = parent_path_end(path, style);
  if (end_pos == StringRef::npos)
    return StringRef();
  else
    return path.substr(0, end_pos);
}